

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_fixture.c
# Opt level: O1

REF_STATUS ref_fixture_hex_grid(REF_GRID_conflict *ref_grid_ptr,REF_MPI ref_mpi)

{
  REF_GRID_conflict pRVar1;
  REF_NODE ref_node;
  REF_DBL *pRVar2;
  REF_DBL *pRVar3;
  uint uVar4;
  long lVar5;
  undefined8 uVar6;
  char *pcVar7;
  REF_INT node;
  REF_INT cell;
  REF_INT nodes [8];
  int local_50;
  REF_INT local_4c;
  REF_INT local_48 [8];
  
  local_48[4] = 4;
  local_48[5] = 5;
  local_48[6] = 6;
  local_48[7] = 7;
  local_48[0] = 0;
  local_48[1] = 1;
  local_48[2] = 2;
  local_48[3] = 3;
  uVar4 = ref_grid_create(ref_grid_ptr,ref_mpi);
  if (uVar4 == 0) {
    pRVar1 = *ref_grid_ptr;
    ref_node = pRVar1->node;
    uVar4 = ref_node_add(ref_node,0,&local_50);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x3aa,"ref_fixture_hex_grid",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar2 = ref_node->real;
    pRVar3 = pRVar2 + (long)local_50 * 0xf;
    *pRVar3 = 0.0;
    pRVar3[1] = 0.0;
    pRVar2[(long)local_50 * 0xf + 2] = 0.0;
    uVar4 = ref_node_add(ref_node,1,&local_50);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x3af,"ref_fixture_hex_grid",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar3 = ref_node->real;
    pRVar3[(long)local_50 * 0xf] = 1.0;
    pRVar3 = pRVar3 + (long)local_50 * 0xf + 1;
    *pRVar3 = 0.0;
    pRVar3[1] = 0.0;
    uVar4 = ref_node_add(ref_node,2,&local_50);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x3b4,"ref_fixture_hex_grid",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar3 = ref_node->real;
    lVar5 = (long)local_50;
    pRVar3[lVar5 * 0xf] = 1.0;
    pRVar3[lVar5 * 0xf + 1] = 1.0;
    pRVar3[lVar5 * 0xf + 2] = 0.0;
    uVar4 = ref_node_add(ref_node,3,&local_50);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x3b9,"ref_fixture_hex_grid",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar3 = ref_node->real;
    lVar5 = (long)local_50;
    pRVar3[lVar5 * 0xf] = 0.0;
    pRVar3[lVar5 * 0xf + 1] = 1.0;
    pRVar3[lVar5 * 0xf + 2] = 0.0;
    uVar4 = ref_node_add(ref_node,4,&local_50);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x3be,"ref_fixture_hex_grid",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar2 = ref_node->real;
    pRVar3 = pRVar2 + (long)local_50 * 0xf;
    *pRVar3 = 0.0;
    pRVar3[1] = 0.0;
    pRVar2[(long)local_50 * 0xf + 2] = 1.0;
    uVar4 = ref_node_add(ref_node,5,&local_50);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x3c3,"ref_fixture_hex_grid",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar3 = ref_node->real;
    lVar5 = (long)local_50;
    pRVar3[lVar5 * 0xf] = 1.0;
    pRVar3[lVar5 * 0xf + 1] = 0.0;
    pRVar3[lVar5 * 0xf + 2] = 1.0;
    uVar4 = ref_node_add(ref_node,6,&local_50);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x3c8,"ref_fixture_hex_grid",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar3 = ref_node->real;
    lVar5 = (long)local_50;
    pRVar3[lVar5 * 0xf] = 1.0;
    pRVar3[lVar5 * 0xf + 1] = 1.0;
    pRVar3[lVar5 * 0xf + 2] = 1.0;
    uVar4 = ref_node_add(ref_node,7,&local_50);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x3cd,"ref_fixture_hex_grid",(ulong)uVar4,"add node");
      return uVar4;
    }
    pRVar3 = ref_node->real;
    lVar5 = (long)local_50;
    pRVar3[lVar5 * 0xf] = 0.0;
    pRVar3[lVar5 * 0xf + 1] = 1.0;
    pRVar3[lVar5 * 0xf + 2] = 1.0;
    uVar4 = ref_node_initialize_n_global(ref_node,8);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x3d2,"ref_fixture_hex_grid",(ulong)uVar4,"init glob");
      return uVar4;
    }
    uVar4 = ref_cell_add(pRVar1->cell[0xb],local_48,&local_4c);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x3d4,"ref_fixture_hex_grid",(ulong)uVar4,"add prism");
      return uVar4;
    }
    local_48[0] = 0;
    local_48[1] = 1;
    local_48[2] = 2;
    local_48[3] = 3;
    local_48[4] = 10;
    uVar4 = ref_cell_add(pRVar1->cell[6],local_48,&local_4c);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x3db,"ref_fixture_hex_grid",(ulong)uVar4,"add quad");
      return uVar4;
    }
    local_48[0] = 4;
    local_48[1] = 7;
    local_48[2] = 6;
    local_48[3] = 5;
    local_48[4] = 10;
    uVar4 = ref_cell_add(pRVar1->cell[6],local_48,&local_4c);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x3e2,"ref_fixture_hex_grid",(ulong)uVar4,"add quad");
      return uVar4;
    }
    local_48[0] = 1;
    local_48[1] = 5;
    local_48[2] = 6;
    local_48[3] = 2;
    local_48[4] = 0x14;
    uVar4 = ref_cell_add(pRVar1->cell[6],local_48,&local_4c);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x3e9,"ref_fixture_hex_grid",(ulong)uVar4,"add quad");
      return uVar4;
    }
    local_48[0] = 0;
    local_48[1] = 3;
    local_48[2] = 7;
    local_48[3] = 4;
    local_48[4] = 0x14;
    uVar4 = ref_cell_add(pRVar1->cell[6],local_48,&local_4c);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x3f0,"ref_fixture_hex_grid",(ulong)uVar4,"add quad");
      return uVar4;
    }
    local_48[0] = 0;
    local_48[1] = 4;
    local_48[2] = 5;
    local_48[3] = 1;
    local_48[4] = 0x1e;
    uVar4 = ref_cell_add(pRVar1->cell[6],local_48,&local_4c);
    if (uVar4 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",
             0x3f7,"ref_fixture_hex_grid",(ulong)uVar4,"add quad");
      return uVar4;
    }
    local_48[0] = 2;
    local_48[1] = 6;
    local_48[2] = 7;
    local_48[3] = 3;
    local_48[4] = 0x1e;
    uVar4 = ref_cell_add(pRVar1->cell[6],local_48,&local_4c);
    if (uVar4 == 0) {
      return 0;
    }
    pcVar7 = "add quad";
    uVar6 = 0x3fe;
  }
  else {
    pcVar7 = "create";
    uVar6 = 0x3a6;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_fixture.c",uVar6,
         "ref_fixture_hex_grid",(ulong)uVar4,pcVar7);
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_fixture_hex_grid(REF_GRID *ref_grid_ptr,
                                        REF_MPI ref_mpi) {
  REF_GRID ref_grid;
  REF_NODE ref_node;
  REF_INT nodes[8] = {0, 1, 2, 3, 4, 5, 6, 7};
  REF_INT cell, node;

  RSS(ref_grid_create(ref_grid_ptr, ref_mpi), "create");
  ref_grid = *ref_grid_ptr;
  ref_node = ref_grid_node(ref_grid);

  RSS(ref_node_add(ref_node, 0, &node), "add node");
  ref_node_xyz(ref_node, 0, node) = 0.0;
  ref_node_xyz(ref_node, 1, node) = 0.0;
  ref_node_xyz(ref_node, 2, node) = 0.0;

  RSS(ref_node_add(ref_node, 1, &node), "add node");
  ref_node_xyz(ref_node, 0, node) = 1.0;
  ref_node_xyz(ref_node, 1, node) = 0.0;
  ref_node_xyz(ref_node, 2, node) = 0.0;

  RSS(ref_node_add(ref_node, 2, &node), "add node");
  ref_node_xyz(ref_node, 0, node) = 1.0;
  ref_node_xyz(ref_node, 1, node) = 1.0;
  ref_node_xyz(ref_node, 2, node) = 0.0;

  RSS(ref_node_add(ref_node, 3, &node), "add node");
  ref_node_xyz(ref_node, 0, node) = 0.0;
  ref_node_xyz(ref_node, 1, node) = 1.0;
  ref_node_xyz(ref_node, 2, node) = 0.0;

  RSS(ref_node_add(ref_node, 4, &node), "add node");
  ref_node_xyz(ref_node, 0, node) = 0.0;
  ref_node_xyz(ref_node, 1, node) = 0.0;
  ref_node_xyz(ref_node, 2, node) = 1.0;

  RSS(ref_node_add(ref_node, 5, &node), "add node");
  ref_node_xyz(ref_node, 0, node) = 1.0;
  ref_node_xyz(ref_node, 1, node) = 0.0;
  ref_node_xyz(ref_node, 2, node) = 1.0;

  RSS(ref_node_add(ref_node, 6, &node), "add node");
  ref_node_xyz(ref_node, 0, node) = 1.0;
  ref_node_xyz(ref_node, 1, node) = 1.0;
  ref_node_xyz(ref_node, 2, node) = 1.0;

  RSS(ref_node_add(ref_node, 7, &node), "add node");
  ref_node_xyz(ref_node, 0, node) = 0.0;
  ref_node_xyz(ref_node, 1, node) = 1.0;
  ref_node_xyz(ref_node, 2, node) = 1.0;

  RSS(ref_node_initialize_n_global(ref_node, 8), "init glob");

  RSS(ref_cell_add(ref_grid_hex(ref_grid), nodes, &cell), "add prism");

  nodes[0] = 0;
  nodes[1] = 1;
  nodes[2] = 2;
  nodes[3] = 3;
  nodes[4] = 10;
  RSS(ref_cell_add(ref_grid_qua(ref_grid), nodes, &cell), "add quad");

  nodes[0] = 4;
  nodes[1] = 7;
  nodes[2] = 6;
  nodes[3] = 5;
  nodes[4] = 10;
  RSS(ref_cell_add(ref_grid_qua(ref_grid), nodes, &cell), "add quad");

  nodes[0] = 1;
  nodes[1] = 5;
  nodes[2] = 6;
  nodes[3] = 2;
  nodes[4] = 20;
  RSS(ref_cell_add(ref_grid_qua(ref_grid), nodes, &cell), "add quad");

  nodes[0] = 0;
  nodes[1] = 3;
  nodes[2] = 7;
  nodes[3] = 4;
  nodes[4] = 20;
  RSS(ref_cell_add(ref_grid_qua(ref_grid), nodes, &cell), "add quad");

  nodes[0] = 0;
  nodes[1] = 4;
  nodes[2] = 5;
  nodes[3] = 1;
  nodes[4] = 30;
  RSS(ref_cell_add(ref_grid_qua(ref_grid), nodes, &cell), "add quad");

  nodes[0] = 2;
  nodes[1] = 6;
  nodes[2] = 7;
  nodes[3] = 3;
  nodes[4] = 30;
  RSS(ref_cell_add(ref_grid_qua(ref_grid), nodes, &cell), "add quad");

  return REF_SUCCESS;
}